

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

void __thiscall
database::Container::Container(Container *this,string *name,impl_schema_type *schema)

{
  impl_schema_type *schema_local;
  string *name_local;
  Container *this_local;
  
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
  ::map(&this->m_schema,schema);
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>,std::default_delete<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>,void>
            ((unique_ptr<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>,std::default_delete<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>>
              *)&this->m_data);
  _PrepareContainer(this);
  return;
}

Assistant:

Container(const std::string& name,const database::impl_schema_type& schema)
    :m_name(name),m_schema(schema) { _PrepareContainer(); }